

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *type,AccessChainFlags flags,
          bool *param_5,uint32_t index)

{
  bool bVar1;
  string sStack_48;
  
  ::std::__cxx11::string::append((char *)expr);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)index,DecorationNonUniform);
  if (bVar1) {
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
    if (!bVar1) {
      bVar1 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                         DecorationBufferBlock);
      if (!bVar1) goto LAB_00220dd9;
    }
    ::std::__cxx11::string::append((char *)expr);
    ::std::__cxx11::string::append((char *)expr);
    bVar1 = true;
  }
  else {
LAB_00220dd9:
    bVar1 = false;
  }
  if ((flags & 1) == 0) {
    to_expression_abi_cxx11_(&sStack_48,this,index,(flags & 8) == 0);
    ::std::__cxx11::string::append((string *)expr);
  }
  else {
    ::std::__cxx11::to_string(&sStack_48,index);
    ::std::__cxx11::string::append((string *)expr);
  }
  ::std::__cxx11::string::~string((string *)&sStack_48);
  if (bVar1) {
    ::std::__cxx11::string::append((char *)expr);
  }
  ::std::__cxx11::string::append((char *)expr);
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType *type,
                                                      AccessChainFlags flags, bool & /*access_chain_is_arrayed*/,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	expr += "[";

	// If we are indexing into an array of SSBOs or UBOs, we need to index it with a non-uniform qualifier.
	bool nonuniform_index =
	    has_decoration(index, DecorationNonUniformEXT) &&
	    (has_decoration(type->self, DecorationBlock) || has_decoration(type->self, DecorationBufferBlock));
	if (nonuniform_index)
	{
		expr += backend.nonuniform_qualifier;
		expr += "(";
	}

	if (index_is_literal)
		expr += convert_to_string(index);
	else
		expr += to_expression(index, register_expression_read);

	if (nonuniform_index)
		expr += ")";

	expr += "]";
}